

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O0

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer *this_00;
  cmRuntimeDependencyArchive *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined8 this_01;
  bool bVar2;
  int iVar3;
  cmMakefile *this_02;
  string *psVar4;
  ulong uVar5;
  cmUVProcessChainBuilder *this_03;
  istream *piVar6;
  char *string;
  reference ppSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  allocator<char> local_319;
  string local_318;
  undefined1 local_2f8 [8];
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  RegularExpressionMatch match;
  string line;
  string local_1c8;
  undefined1 local_1a8 [8];
  cmUVProcessChain process;
  cmUVProcessChainBuilder builder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ldConfigCommand;
  string local_150;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12d;
  undefined1 local_12c;
  allocator<char> local_12b;
  allocator<char> local_12a;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  iterator local_c0;
  size_type local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string ldConfigPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  cmLDConfigLDConfigTool *this_local;
  
  ldConfigPath.field_2._8_8_ = paths;
  this_02 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_LDCONFIG_COMMAND",&local_61);
  psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_60);
  std::__cxx11::string::string((string *)local_40,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    local_12c = 1;
    local_128 = &local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"/sbin",&local_129);
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_100,"/usr/sbin",&local_12a);
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"/usr/local/sbin",&local_12b);
    local_12c = 0;
    local_c0 = &local_120;
    local_b8 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_12d);
    __l._M_len = local_b8;
    __l._M_array = local_c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b0,__l,&local_12d);
    cmsys::SystemTools::FindProgram(&local_98,"ldconfig",&local_b0,false);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_12d);
    local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
    do {
      local_380 = local_380 + -1;
      std::__cxx11::string::~string((string *)local_380);
    } while (local_380 != &local_120);
    std::allocator<char>::~allocator(&local_12b);
    std::allocator<char>::~allocator(&local_12a);
    std::allocator<char>::~allocator(&local_129);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Could not find ldconfig",
                 (allocator<char> *)
                 ((long)&ldConfigCommand.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmRuntimeDependencyArchive::SetError(pcVar1,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ldConfigCommand.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      this_local._7_1_ = false;
      ldConfigCommand.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_00599b4d;
    }
  }
  this_00 = &builder.Processes.
             super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  cmSystemTools::ExpandListArgument
            ((string *)local_40,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &builder.Processes.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &builder.Processes.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &builder.Processes.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
  this_03 = cmUVProcessChainBuilder::SetBuiltinStream
                      ((cmUVProcessChainBuilder *)&process,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand
            (this_03,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&builder.Processes.
                         super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_1a8);
  bVar2 = cmUVProcessChain::Valid((cmUVProcessChain *)local_1a8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&match.searchstring);
    if ((GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
         regex == '\0') &&
       (iVar3 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex), iVar3 != 0)) {
      cmsys::RegularExpression::RegularExpression(&GetLDConfigPaths::regex,"^([^\t:]*):");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                   &__dso_handle);
      __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::regex);
    }
    while( true ) {
      piVar6 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_1a8);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar6,(string *)&match.searchstring);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar2) break;
      cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_298);
      string = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        (&GetLDConfigPaths::regex,string,(RegularExpressionMatch *)local_298);
      this_01 = ldConfigPath.field_2._8_8_;
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_2b8,(RegularExpressionMatch *)local_298,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
      }
    }
    bVar2 = cmUVProcessChain::Wait((cmUVProcessChain *)local_1a8,-1);
    if (bVar2) {
      cmUVProcessChain::GetStatus
                ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *)local_2f8,(cmUVProcessChain *)local_1a8);
      ppSVar7 = std::
                vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                ::operator[]((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                              *)local_2f8,0);
      if ((*ppSVar7 == (value_type)0x0) ||
         (ppSVar7 = std::
                    vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    ::operator[]((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                  *)local_2f8,0), (*ppSVar7)->ExitStatus != 0)) {
        pcVar1 = (this->super_cmLDConfigTool).Archive;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,"Failed to run ldconfig",&local_319);
        cmRuntimeDependencyArchive::SetError(pcVar1,&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator(&local_319);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      ldConfigCommand.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::
      vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>::
      ~vector((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
               *)local_2f8);
    }
    else {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"Failed to wait on ldconfig process",
                 (allocator<char> *)
                 ((long)&status.
                         super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmRuntimeDependencyArchive::SetError(pcVar1,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&status.
                         super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      this_local._7_1_ = false;
      ldConfigCommand.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&match.searchstring);
  }
  else {
    pcVar1 = (this->super_cmLDConfigTool).Archive;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Failed to start ldconfig process",
               (allocator<char> *)(line.field_2._M_local_buf + 0xf));
    cmRuntimeDependencyArchive::SetError(pcVar1,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
    this_local._7_1_ = false;
    ldConfigCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_1a8);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&builder.Processes.
                super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00599b4d:
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  std::vector<std::string> ldConfigCommand;
  cmSystemTools::ExpandListArgument(ldConfigPath, ldConfigCommand);
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid()) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}